

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall TPZManVector<int,_3>::Resize(TPZManVector<int,_3> *this,int64_t newsize)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  long in_RSI;
  TPZManVector<int,_3> *in_RDI;
  int64_t i_1;
  int *newstore;
  int64_t realsize;
  int64_t i;
  long local_30;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<int>).fNElements) {
    if ((in_RDI->super_TPZVec<int>).fNAlloc < in_RSI) {
      if (in_RSI < 4) {
        if ((in_RDI->super_TPZVec<int>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<int>).fNElements;
              local_18 = local_18 + 1) {
            in_RDI->fExtAlloc[local_18] = (in_RDI->super_TPZVec<int>).fStore[local_18];
          }
          piVar5 = (in_RDI->super_TPZVec<int>).fStore;
          if (piVar5 != (int *)0x0) {
            operator_delete__(piVar5);
          }
          (in_RDI->super_TPZVec<int>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<int>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<int>).fNAlloc = 0;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar3;
        uVar4 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        piVar5 = (int *)operator_new__(uVar4);
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<int>).fNElements;
            local_30 = local_30 + 1) {
          piVar5[local_30] = (in_RDI->super_TPZVec<int>).fStore[local_30];
        }
        if (((in_RDI->super_TPZVec<int>).fStore != in_RDI->fExtAlloc) &&
           (piVar1 = (in_RDI->super_TPZVec<int>).fStore, piVar1 != (int *)0x0)) {
          operator_delete__(piVar1);
        }
        (in_RDI->super_TPZVec<int>).fStore = piVar5;
        (in_RDI->super_TPZVec<int>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<int>).fNAlloc = uVar3;
      }
    }
    else {
      (in_RDI->super_TPZVec<int>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}